

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O1

Error __thiscall
asmjit::BaseCompiler::_newReg(BaseCompiler *this,BaseReg *out,BaseReg *ref,char *name)

{
  byte bVar1;
  uint32_t uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  Error EVar6;
  Error unaff_EBP;
  uint32_t typeId;
  RegInfo regInfo;
  VirtReg *vReg;
  uint32_t local_38;
  RegInfo local_34;
  VirtReg *local_30;
  
  (out->super_Operand).super_Operand_._signature = 0;
  (out->super_Operand).super_Operand_._baseId = 0;
  (out->super_Operand).super_Operand_._data[0] = 0;
  (out->super_Operand).super_Operand_._data[1] = 0;
  uVar4 = (ref->super_Operand).super_Operand_._baseId - 0x100;
  if ((this->_vRegArray).super_ZoneVectorBase._size <= uVar4) {
    local_38 = (ref->super_Operand).super_Operand_._signature >> 3 & 0x1f;
    goto LAB_00116eed;
  }
  bVar1 = *(byte *)(*(long *)((long)(this->_vRegArray).super_ZoneVectorBase._data + (ulong)uVar4 * 8
                             ) + 0xd);
  local_38 = (uint32_t)bVar1;
  uVar4 = (ref->super_Operand).super_Operand_._signature >> 0x18;
  bVar3 = true;
  if (uVar4 != (byte)Type::_typeData[(ulong)bVar1 + 0x100]) {
    if (9 < bVar1 - 0x20) {
      if (bVar1 - 0x31 < 2) {
        local_38 = 0x32;
      }
      else if (bVar1 - 0x2d < 4) {
        switch(uVar4) {
        case 1:
          local_38 = 0x2d;
          break;
        case 2:
          local_38 = 0x2e;
          break;
        default:
          goto switchD_00116e46_caseD_3;
        case 4:
          local_38 = 0x2f;
          break;
        case 8:
          local_38 = 0x30;
        }
      }
      else {
        bVar1 = Type::_typeData[bVar1];
        if (uVar4 == 0x40) {
          local_38 = bVar1 + 0x39;
        }
        else if (uVar4 == 0x20) {
          local_38 = bVar1 + 0x2f;
        }
        else {
          if (uVar4 != 0x10) goto switchD_00116e46_caseD_3;
          local_38 = bVar1 + 0x25;
        }
      }
      goto LAB_00116ece;
    }
    if (uVar4 - 1 < 8) {
      uVar5 = (uint)bVar1;
      switch(uVar4) {
      case 1:
        local_38 = uVar5 & 1 | 0x22;
        break;
      case 2:
        local_38 = uVar5 & 1 | 0x24;
        break;
      default:
        goto switchD_00116e46_caseD_3;
      case 4:
        local_38 = uVar5 & 1 | 0x26;
        break;
      case 8:
        local_38 = local_38 & 1 | 0x28;
      }
    }
    else {
switchD_00116e46_caseD_3:
      local_38 = 0;
    }
LAB_00116ece:
    if (local_38 == 0) {
      bVar3 = false;
      unaff_EBP = BaseEmitter::reportError((BaseEmitter *)this,3,(char *)0x0);
    }
  }
  if (!bVar3) {
    return unaff_EBP;
  }
LAB_00116eed:
  EVar6 = ArchUtils::typeIdToRegInfo
                    ((uint)(this->super_BaseBuilder).super_BaseEmitter._environment._arch,local_38,
                     &local_38,&local_34);
  if (EVar6 == 0) {
    EVar6 = newVirtReg(this,&local_30,local_38,local_34._signature,name);
    if (EVar6 == 0) {
      uVar2 = local_30->_id;
      (out->super_Operand).super_Operand_._signature = local_34._signature;
      (out->super_Operand).super_Operand_._baseId = uVar2;
      (out->super_Operand).super_Operand_._data[0] = 0;
      (out->super_Operand).super_Operand_._data[1] = 0;
      EVar6 = 0;
    }
  }
  else {
    EVar6 = BaseEmitter::reportError((BaseEmitter *)this,EVar6,(char *)0x0);
  }
  return EVar6;
}

Assistant:

Error BaseCompiler::_newReg(BaseReg* out, const BaseReg& ref, const char* name) {
  out->reset();

  RegInfo regInfo;
  uint32_t typeId;

  if (isVirtRegValid(ref)) {
    VirtReg* vRef = virtRegByReg(ref);
    typeId = vRef->typeId();

    // NOTE: It's possible to cast one register type to another if it's the
    // same register group. However, VirtReg always contains the TypeId that
    // was used to create the register. This means that in some cases we may
    // end up having different size of `ref` and `vRef`. In such case we
    // adjust the TypeId to match the `ref` register type instead of the
    // original register type, which should be the expected behavior.
    uint32_t typeSize = Type::sizeOf(typeId);
    uint32_t refSize = ref.size();

    if (typeSize != refSize) {
      if (Type::isInt(typeId)) {
        // GP register - change TypeId to match `ref`, but keep sign of `vRef`.
        switch (refSize) {
          case  1: typeId = Type::kIdI8  | (typeId & 1); break;
          case  2: typeId = Type::kIdI16 | (typeId & 1); break;
          case  4: typeId = Type::kIdI32 | (typeId & 1); break;
          case  8: typeId = Type::kIdI64 | (typeId & 1); break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else if (Type::isMmx(typeId)) {
        // MMX register - always use 64-bit.
        typeId = Type::kIdMmx64;
      }
      else if (Type::isMask(typeId)) {
        // Mask register - change TypeId to match `ref` size.
        switch (refSize) {
          case  1: typeId = Type::kIdMask8; break;
          case  2: typeId = Type::kIdMask16; break;
          case  4: typeId = Type::kIdMask32; break;
          case  8: typeId = Type::kIdMask64; break;
          default: typeId = Type::kIdVoid; break;
        }
      }
      else {
        // VEC register - change TypeId to match `ref` size, keep vector metadata.
        uint32_t elementTypeId = Type::baseOf(typeId);

        switch (refSize) {
          case 16: typeId = Type::_kIdVec128Start + (elementTypeId - Type::kIdI8); break;
          case 32: typeId = Type::_kIdVec256Start + (elementTypeId - Type::kIdI8); break;
          case 64: typeId = Type::_kIdVec512Start + (elementTypeId - Type::kIdI8); break;
          default: typeId = Type::kIdVoid; break;
        }
      }

      if (typeId == Type::kIdVoid)
        return reportError(DebugUtils::errored(kErrorInvalidState));
    }
  }
  else {
    typeId = ref.type();
  }

  Error err = ArchUtils::typeIdToRegInfo(arch(), typeId, &typeId, &regInfo);
  if (ASMJIT_UNLIKELY(err))
    return reportError(err);

  VirtReg* vReg;
  ASMJIT_PROPAGATE(newVirtReg(&vReg, typeId, regInfo.signature(), name));

  out->_initReg(regInfo.signature(), vReg->id());
  return kErrorOk;
}